

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgsv(fitsfile *fptr,int datatype,long *blc,long *trc,long *inc,void *nulval,void *array,
         int *anynul,int *status)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int *in_stack_00000018;
  LONGLONG nelem;
  long naxes [9];
  int ii;
  int naxis;
  long *in_stack_00000240;
  long *in_stack_00000248;
  long *in_stack_00000250;
  int in_stack_00000258;
  int in_stack_0000025c;
  fitsfile *in_stack_00000260;
  void *in_stack_00000268;
  LONGLONG in_stack_00000270;
  undefined4 in_stack_00000278;
  float in_stack_0000027c;
  undefined4 in_stack_00000280;
  int in_stack_00000284;
  fitsfile *in_stack_00000288;
  long *in_stack_00000290;
  unsigned_short in_stack_00000298;
  undefined2 in_stack_0000029a;
  int in_stack_0000029c;
  fitsfile *in_stack_000002a0;
  int in_stack_000002a8;
  int in_stack_000002ac;
  fitsfile *in_stack_000002b0;
  long *in_stack_000002d0;
  float *in_stack_000002d8;
  long *in_stack_000002e0;
  uchar in_stack_000002e8;
  undefined1 in_stack_000002e9;
  undefined2 in_stack_000002ea;
  undefined4 in_stack_000002ec;
  ULONGLONG *in_stack_000002f0;
  int *in_stack_000002f8;
  int *in_stack_00000300;
  fitsfile *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  long local_a8 [10];
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  int local_2c;
  int local_1c;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (*in_stack_00000018 < 1) {
    local_50 = in_R9;
    local_48 = in_R8;
    local_40 = in_RCX;
    local_38 = in_RDX;
    local_2c = in_ESI;
    ffgidm(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
           &in_stack_ffffffffffffff28->HDUposition);
    ffgisz(in_stack_ffffffffffffff48,iVar1,(long *)in_stack_ffffffffffffff38,
           in_stack_ffffffffffffff30);
    iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff28,(int *)0x17489f);
    if (iVar1 == 0) {
      for (local_58 = 0;
          (((local_58 < local_54 && (*(long *)(local_48 + (long)local_58 * 8) == 1)) &&
           (*(long *)(local_38 + (long)local_58 * 8) == 1)) &&
          (*(long *)(local_40 + (long)local_58 * 8) == local_a8[local_58])); local_58 = local_58 + 1
          ) {
      }
      if (local_58 == local_54) {
        ffgpxv(in_stack_00000288,in_stack_00000284,
               (long *)CONCAT44(in_stack_0000027c,in_stack_00000278),in_stack_00000270,
               in_stack_00000268,in_stack_00000260,&in_stack_000002a0->HDUposition,
               (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8));
        return *in_stack_00000018;
      }
    }
    if (local_2c == 0xb) {
      if (local_50 == 0) {
        ffgsvb(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,in_stack_000002e8,(uchar *)in_stack_000002f0,
               in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvb(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,in_stack_000002e8,(uchar *)in_stack_000002f0,
               in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0xc) {
      if (local_50 == 0) {
        ffgsvsb(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                in_stack_00000290,in_stack_000002e0,in_stack_000002e8,(char *)in_stack_000002f0,
                in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvsb(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                in_stack_00000290,in_stack_000002e0,in_stack_000002e8,(char *)in_stack_000002f0,
                in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x14) {
      if (local_50 == 0) {
        ffgsvui(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,in_stack_00000298,
                (unsigned_short *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
      else {
        ffgsvui(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,in_stack_00000298,
                (unsigned_short *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
    }
    else if (local_2c == 0x15) {
      if (local_50 == 0) {
        ffgsvi(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,CONCAT11(in_stack_000002e9,in_stack_000002e8),
               (short *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvi(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,CONCAT11(in_stack_000002e9,in_stack_000002e8),
               (short *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x1e) {
      if (local_50 == 0) {
        ffgsvuk(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,
                CONCAT22(in_stack_0000029a,in_stack_00000298),(uint *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
      else {
        ffgsvuk(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,
                CONCAT22(in_stack_0000029a,in_stack_00000298),(uint *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
    }
    else if (local_2c == 0x1f) {
      if (local_50 == 0) {
        ffgsvk(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,
               CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8)),
               (int *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvk(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,
               CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8)),
               (int *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x28) {
      if (local_50 == 0) {
        ffgsvuj(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,
                CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                (unsigned_long *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
      else {
        ffgsvuj(in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000250,
                in_stack_00000248,in_stack_00000240,in_stack_00000290,
                CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                (unsigned_long *)in_stack_000002a0,
                (int *)CONCAT44(in_stack_000002ac,in_stack_000002a8),&in_stack_000002b0->HDUposition
               );
      }
    }
    else if (local_2c == 0x29) {
      if (local_50 == 0) {
        ffgsvj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,
               CONCAT44(in_stack_000002ec,
                        CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
               (long *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,
               CONCAT44(in_stack_000002ec,
                        CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
               (long *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x50) {
      if (local_50 == 0) {
        ffgsvujj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                 (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                 in_stack_00000290,in_stack_000002e0,
                 CONCAT44(in_stack_000002ec,
                          CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8)))
                 ,in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvujj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                 (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                 in_stack_00000290,in_stack_000002e0,
                 CONCAT44(in_stack_000002ec,
                          CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8)))
                 ,in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x51) {
      if (local_50 == 0) {
        ffgsvjj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                in_stack_00000290,in_stack_000002e0,
                CONCAT44(in_stack_000002ec,
                         CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
                (LONGLONG *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
      else {
        ffgsvjj(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
                (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
                in_stack_00000290,in_stack_000002e0,
                CONCAT44(in_stack_000002ec,
                         CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
                (LONGLONG *)in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
      }
    }
    else if (local_2c == 0x2a) {
      if (local_50 == 0) {
        ffgsve(in_stack_000002a0,in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298),
               in_stack_00000290,(long *)in_stack_00000288,
               (long *)CONCAT44(in_stack_00000284,in_stack_00000280),in_stack_000002d0,
               in_stack_0000027c,in_stack_000002d8,(int *)in_stack_000002e0,
               (int *)CONCAT44(in_stack_000002ec,
                               CONCAT22(in_stack_000002ea,
                                        CONCAT11(in_stack_000002e9,in_stack_000002e8))));
      }
      else {
        ffgsve(in_stack_000002a0,in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298),
               in_stack_00000290,(long *)in_stack_00000288,
               (long *)CONCAT44(in_stack_00000284,in_stack_00000280),in_stack_000002d0,
               in_stack_0000027c,in_stack_000002d8,(int *)in_stack_000002e0,
               (int *)CONCAT44(in_stack_000002ec,
                               CONCAT22(in_stack_000002ea,
                                        CONCAT11(in_stack_000002e9,in_stack_000002e8))));
      }
    }
    else if (local_2c == 0x52) {
      if (local_50 == 0) {
        ffgsvd(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,(double)in_stack_00000288,
               (double *)
               CONCAT44(in_stack_000002ec,
                        CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
               (int *)in_stack_000002f0,in_stack_000002f8);
      }
      else {
        ffgsvd(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,(long *)in_stack_000002a0,
               (long *)CONCAT44(in_stack_0000029c,CONCAT22(in_stack_0000029a,in_stack_00000298)),
               in_stack_00000290,in_stack_000002e0,(double)in_stack_00000288,
               (double *)
               CONCAT44(in_stack_000002ec,
                        CONCAT22(in_stack_000002ea,CONCAT11(in_stack_000002e9,in_stack_000002e8))),
               (int *)in_stack_000002f0,in_stack_000002f8);
      }
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    local_1c = *in_stack_00000018;
  }
  else {
    local_1c = *in_stack_00000018;
  }
  return local_1c;
}

Assistant:

int ffgsv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            long *inc,        /* I - increment to be applied in each dim.    */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an section of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    long naxes[9];
    LONGLONG nelem = 1;

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    /* test for the important special case where we are reading the whole image */
    /* this is only useful for images that are not tile-compressed */
    if (!fits_is_compressed_image(fptr, status)) {
        for (ii = 0; ii < naxis; ii++) {
            if (inc[ii] != 1 || blc[ii] !=1 || trc[ii] != naxes[ii])
                break;

            nelem = nelem * naxes[ii];
        }

        if (ii == naxis) {
            /* read the whole image more efficiently */
            ffgpxv(fptr, datatype, blc, nelem, nulval, array, anynul, status);
            return(*status);
        }
    }

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (signed char *) array, anynul, status);
      else
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgsvui(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgsvui(fptr, 1, naxis, naxes,blc, trc, inc, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (short *) array, anynul, status);
      else
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (int *) array, anynul, status);
      else
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (long *) array, anynul, status);
      else
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (float *) array, anynul, status);
      else
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (double *) array, anynul, status);
      else
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, *(double *) nulval,
               (double *) array, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}